

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::split_selected_edge(Mesh *this)

{
  Edge *this_00;
  pointer this_01;
  HalfedgeElement *in_RDI;
  Edge *edge;
  HalfedgeElement *element;
  EdgeIter e0;
  
  if ((in_RDI[0x12]._vptr_HalfedgeElement != (_func_int **)0x0) &&
     (this_00 = HalfedgeElement::getEdge(in_RDI), this_00 != (Edge *)0x0)) {
    e0._M_node = (_List_node_base *)(in_RDI + 0x17);
    Edge::halfedge(this_00);
    this_01 = std::_List_iterator<CGL::Halfedge>::operator->
                        ((_List_iterator<CGL::Halfedge> *)0x133253);
    Halfedge::edge(this_01);
    HalfedgeMesh::splitEdge((HalfedgeMesh *)0x133271,e0);
    (*in_RDI->_vptr_HalfedgeElement[8])();
  }
  return;
}

Assistant:

void Mesh::split_selected_edge() {
  HalfedgeElement *element = selectedFeature.element;
  if (element == nullptr) return;
  Edge *edge = element->getEdge();
  if (edge == nullptr) return;
  mesh.splitEdge(edge->halfedge()->edge());
  invalidate_selection();
}